

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
llvm::sys::Process::FindInEnvPath
          (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,StringRef EnvName,StringRef FileName,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          IgnoreList)

{
  StringRef Source;
  OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *pOVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int iVar8;
  long lVar9;
  Child CVar10;
  StringRef Name;
  StringRef Delimiters;
  char EnvPathSeparatorStr [2];
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> OptPath
  ;
  SmallString<128U> FilePath;
  SmallVector<llvm::StringRef,_8U> Dirs;
  char local_212 [2];
  OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_210;
  char *local_208;
  Child CStack_200;
  Child local_1f8;
  undefined8 local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  Child *local_1d8;
  long *local_1d0;
  size_t local_1c8;
  long local_1c0 [2];
  bool local_1b0;
  StringRef local_1a8;
  char **local_198;
  ulong local_190;
  char *local_188 [16];
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  Child local_c0;
  ulong local_b8;
  Twine local_b0 [5];
  
  local_1a8.Length = FileName.Length;
  pcVar5 = FileName.Data;
  Name.Data = (char *)EnvName.Length;
  local_1a8.Data = pcVar5;
  Twine::Twine((Twine *)&local_c0,&local_1a8);
  bVar2 = sys::path::is_absolute((Twine *)&local_c0,native);
  if (bVar2) {
    __assert_fail("!path::is_absolute(FileName)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Process.cpp"
                  ,0x26,
                  "static Optional<std::string> llvm::sys::Process::FindInEnvPath(StringRef, StringRef, ArrayRef<std::string>)"
                 );
  }
  (__return_storage_ptr__->Storage).hasVal = false;
  Name.Length = (size_t)pcVar5;
  local_210 = &__return_storage_ptr__->Storage;
  GetEnv_abi_cxx11_((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1d0,(Process *)EnvName.Data,Name);
  if (local_1b0 == true) {
    local_212[0] = ':';
    local_212[1] = '\0';
    local_c0.twine = local_b0;
    local_b8 = 0x800000000;
    Source.Length = local_1c8;
    Source.Data = (char *)local_1d0;
    sVar4 = strlen(local_212);
    Delimiters.Length = sVar4;
    Delimiters.Data = local_212;
    SplitString(Source,(SmallVectorImpl<llvm::StringRef> *)&local_c0,Delimiters);
    if ((local_b8 & 0xffffffff) != 0) {
      local_1d8 = &(local_c0.twine)->LHS + (local_b8 & 0xffffffff) * 2;
      CVar10 = local_c0;
      do {
        local_208 = ((Child *)&(CVar10.stringRef)->Data)->cString;
        CStack_200 = ((Child *)&(CVar10.smallString)->super_SmallVectorTemplateBase<char,_true>)[1];
        iVar8 = 3;
        if (CStack_200.twine != (Twine *)0x0) {
          pbVar6 = IgnoreList.Data + IgnoreList.Length;
          local_198 = &local_208;
          __it = IgnoreList.Data;
          if (0 < (long)IgnoreList.Length >> 2) {
            lVar9 = ((long)IgnoreList.Length >> 2) + 1;
            do {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_198,__it);
              pbVar7 = __it;
              if (bVar2) goto LAB_0019af36;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_198,__it + 1);
              pbVar7 = __it + 1;
              if (bVar2) goto LAB_0019af36;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_198,__it + 2);
              pbVar7 = __it + 2;
              if (bVar2) goto LAB_0019af36;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_198,__it + 3);
              pbVar7 = __it + 3;
              if (bVar2) goto LAB_0019af36;
              __it = __it + 4;
              lVar9 = lVar9 + -1;
            } while (1 < lVar9);
          }
          lVar9 = (long)pbVar6 - (long)__it >> 5;
          if (lVar9 == 1) {
LAB_0019af19:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                    ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                  *)&local_198,__it);
            pbVar7 = __it;
            if (!bVar2) {
              pbVar7 = pbVar6;
            }
          }
          else if (lVar9 == 2) {
LAB_0019aef1:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                    ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                  *)&local_198,__it);
            pbVar7 = __it;
            if (!bVar2) {
              __it = __it + 1;
              goto LAB_0019af19;
            }
          }
          else {
            pbVar7 = pbVar6;
            if ((lVar9 == 3) &&
               (bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                        ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                      *)&local_198,__it), pbVar7 = __it, !bVar2)) {
              __it = __it + 1;
              goto LAB_0019aef1;
            }
          }
LAB_0019af36:
          iVar8 = 3;
          if (pbVar7 == pbVar6) {
            local_190 = 0x8000000000;
            local_198 = local_188;
            SmallVectorImpl<char>::append<char_const*,void>
                      ((SmallVectorImpl<char> *)&local_198,local_208,local_208 + CStack_200.cString)
            ;
            Twine::Twine((Twine *)&local_1f8,&local_1a8);
            Twine::Twine(&local_d8,"");
            Twine::Twine(&local_f0,"");
            Twine::Twine(&local_108,"");
            sys::path::append((SmallVectorImpl<char> *)&local_198,(Twine *)&local_1f8,&local_d8,
                              &local_f0,&local_108);
            Twine::Twine((Twine *)&local_1f8,(SmallVectorImpl<char> *)&local_198);
            iVar8 = 0;
            iVar3 = fs::access(&local_1f8.character,0);
            if (iVar3 == 0) {
              if (local_198 == (char **)0x0) {
                local_1f8.twine = (Twine *)&local_1e8;
                local_1f0 = 0;
                local_1e8._M_local_buf[0] = '\0';
              }
              else {
                local_1f8.twine = (Twine *)&local_1e8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1f8,local_198,(local_190 & 0xffffffff) + (long)local_198
                          );
              }
              optional_detail::
              OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::operator=(local_210,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8.twine != &local_1e8) {
                operator_delete(local_1f8.twine,
                                CONCAT71(local_1e8._M_allocated_capacity._1_7_,
                                         local_1e8._M_local_buf[0]) + 1);
              }
              iVar8 = 2;
            }
            if (local_198 != local_188) {
              free(local_198);
            }
          }
        }
      } while (((iVar8 == 3) || (iVar8 == 0)) &&
              (CVar10.twine = (Twine *)&(CVar10.twine)->LHSKind, CVar10.twine != (Twine *)local_1d8)
              );
    }
    if (local_c0.twine != local_b0) {
      free(local_c0.twine);
    }
  }
  pOVar1 = local_210;
  if ((local_1b0 == true) && (local_1d0 != local_1c0)) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)pOVar1;
}

Assistant:

Optional<std::string> Process::FindInEnvPath(StringRef EnvName,
                                             StringRef FileName,
                                             ArrayRef<std::string> IgnoreList) {
  assert(!path::is_absolute(FileName));
  Optional<std::string> FoundPath;
  Optional<std::string> OptPath = Process::GetEnv(EnvName);
  if (!OptPath.hasValue())
    return FoundPath;

  const char EnvPathSeparatorStr[] = {EnvPathSeparator, '\0'};
  SmallVector<StringRef, 8> Dirs;
  SplitString(OptPath.getValue(), Dirs, EnvPathSeparatorStr);

  for (StringRef Dir : Dirs) {
    if (Dir.empty())
      continue;

    if (any_of(IgnoreList, [&](StringRef S) { return fs::equivalent(S, Dir); }))
      continue;

    SmallString<128> FilePath(Dir);
    path::append(FilePath, FileName);
    if (fs::exists(Twine(FilePath))) {
      FoundPath = FilePath.str();
      break;
    }
  }

  return FoundPath;
}